

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readAssociativeContainer<QMap<QFont::Tag,float>>
          (QDataStream *s,QMap<QFont::Tag,_float> *c)

{
  Status SVar1;
  qint64 qVar2;
  QDataStream *this;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  mapped_type_conflict t;
  key_type k;
  StreamStateSaver stateSaver;
  QDataStream *in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  QDataStream *stream;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float local_20;
  Tag local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver
            ((StreamStateSaver *)in_stack_ffffffffffffffa0._M_node,in_stack_ffffffffffffff98);
  QMap<QFont::Tag,_float>::clear((QMap<QFont::Tag,_float> *)in_stack_ffffffffffffffa0._M_node);
  qVar2 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffffa0._M_node);
  if (qVar2 < 0) {
    QDataStream::setStatus((Status)in_RDI);
  }
  else {
    for (stream = (QDataStream *)0x0; (long)stream < qVar2; stream = stream + 1) {
      local_1c.m_value = 0xaaaaaaaa;
      QFont::Tag::Tag(&local_1c);
      local_20 = -NAN;
      this = ::operator>>(stream,(Tag *)in_stack_ffffffffffffffa0._M_node);
      QDataStream::operator>>(this,&local_20);
      SVar1 = QDataStream::status(in_RDI);
      if (SVar1 != Ok) {
        QMap<QFont::Tag,_float>::clear((QMap<QFont::Tag,_float> *)in_stack_ffffffffffffffa0._M_node)
        ;
        break;
      }
      in_stack_ffffffffffffffa0._M_node =
           (_Base_ptr)
           QMap<QFont::Tag,_float>::insert
                     ((QMap<QFont::Tag,_float> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(Tag *)stream,
                      in_stack_ffffffffffffffa0._M_node);
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)in_stack_ffffffffffffffa0._M_node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readAssociativeContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::key_type k;
        typename Container::mapped_type t;
        s >> k >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.insert(k, t);
    }

    return s;
}